

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall
QMainWindowLayout::setCurrentHoveredFloat(QMainWindowLayout *this,QDockWidgetGroupWindow *w)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  QDockWidgetGroupWindow *pQVar6;
  QDockWidgetGroupWindow *pQVar7;
  long in_FS_OFFSET;
  Connection local_68;
  QObject local_60 [8];
  QSlotObjectBase local_58;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x7f0);
  if (lVar1 == 0) {
    if (w == (QDockWidgetGroupWindow *)0x0) goto LAB_00434fb4;
LAB_00434ddc:
    restore(this,true);
LAB_00434e56:
    uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)w);
    bVar3 = false;
  }
  else {
    pQVar7 = *(QDockWidgetGroupWindow **)(this + 0x7f8);
    pQVar6 = (QDockWidgetGroupWindow *)0x0;
    if (*(int *)(lVar1 + 4) != 0) {
      pQVar6 = pQVar7;
    }
    if (pQVar6 == w) goto LAB_00434fb4;
    if (pQVar7 == (QDockWidgetGroupWindow *)0x0 || *(int *)(lVar1 + 4) == 0) {
      if (w != (QDockWidgetGroupWindow *)0x0) goto LAB_00434ddc;
    }
    else {
      pQVar6 = (QDockWidgetGroupWindow *)0x0;
      if (*(int *)(lVar1 + 4) == 0) {
        pQVar7 = pQVar6;
      }
      local_48 = QObject::destroyed;
      local_40 = 0;
      local_58._0_8_ = updateGapIndicator;
      local_58.m_impl = (ImplFn)0x0;
      QObject::disconnectImpl
                ((QObject *)pQVar7,&local_48,(QObject *)this,(void **)&local_58,
                 (QMetaObject *)&QObject::staticMetaObject);
      if (*(long *)(this + 0x7f0) != 0) {
        if (*(int *)(*(long *)(this + 0x7f0) + 4) == 0) {
          pQVar6 = (QDockWidgetGroupWindow *)0x0;
        }
        else {
          pQVar6 = *(QDockWidgetGroupWindow **)(this + 0x7f8);
        }
      }
      local_48 = QDockWidgetGroupWindow::resized;
      local_40 = 0;
      local_58._0_8_ = updateGapIndicator;
      local_58.m_impl = (ImplFn)0x0;
      QObject::disconnectImpl
                ((QObject *)pQVar6,&local_48,(QObject *)this,(void **)&local_58,
                 &QDockWidgetGroupWindow::staticMetaObject);
      if ((*(long *)(this + 0x7f0) != 0) &&
         (*(QDockWidgetGroupWindow **)(this + 0x7f8) != (QDockWidgetGroupWindow *)0x0 &&
          *(int *)(*(long *)(this + 0x7f0) + 4) != 0)) {
        QDockWidgetGroupWindow::restore(*(QDockWidgetGroupWindow **)(this + 0x7f8));
      }
      if (w != (QDockWidgetGroupWindow *)0x0) goto LAB_00434e56;
    }
    bVar3 = true;
    uVar4 = 0;
  }
  piVar2 = *(int **)(this + 0x7f0);
  *(undefined8 *)(this + 0x7f0) = uVar4;
  *(QDockWidgetGroupWindow **)(this + 0x7f8) = w;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  if (!bVar3) {
    local_58._0_8_ = updateGapIndicator;
    local_58.m_impl = (ImplFn)0x0;
    local_48 = QObject::destroyed;
    local_40 = 0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QCallableObject<void_(QMainWindowLayout::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar5 + 4) = updateGapIndicator;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)w,(QObject *)&local_48,(void **)this,&local_58,
               (ConnectionType)puVar5,(int *)0x80,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    local_58._0_8_ = updateGapIndicator;
    local_58.m_impl = (ImplFn)0x0;
    local_48 = QDockWidgetGroupWindow::resized;
    local_40 = 0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QCallableObject<void_(QMainWindowLayout::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar5 + 4) = updateGapIndicator;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_68,(void **)w,(QObject *)&local_48,(void **)this,&local_58,
               (ConnectionType)puVar5,(int *)0x80,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_68);
  }
  updateGapIndicator(this);
LAB_00434fb4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::setCurrentHoveredFloat(QDockWidgetGroupWindow *w)
{
    if (currentHoveredFloat != w) {
        if (currentHoveredFloat) {
            disconnect(currentHoveredFloat.data(), &QObject::destroyed,
                       this, &QMainWindowLayout::updateGapIndicator);
            disconnect(currentHoveredFloat.data(), &QDockWidgetGroupWindow::resized,
                       this, &QMainWindowLayout::updateGapIndicator);
            if (currentHoveredFloat)
                currentHoveredFloat->restore();
        } else if (w) {
            restore(true);
        }

        currentHoveredFloat = w;

        if (w) {
            connect(w, &QObject::destroyed,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
            connect(w, &QDockWidgetGroupWindow::resized,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
        }

        updateGapIndicator();
    }
}